

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void conv_fmt_16bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                     int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i_dst;
  int i_src;
  int width2;
  short *pdst;
  short *psrc;
  int local_30;
  int j;
  int i;
  int src_stride_local;
  int height_local;
  int width_local;
  uchar **dst_local;
  uchar *src_uv_local;
  uchar *src_y_local;
  
  _i_src = *dst;
  iVar1 = *dst_stride;
  pdst = (short *)src_y;
  for (local_30 = 0; local_30 < height; local_30 = local_30 + 1) {
    memcpy(_i_src,pdst,(long)(width << 1));
    pdst = pdst + (src_stride >> 1);
    _i_src = _i_src + (long)(iVar1 >> 1) * 2;
  }
  iVar2 = width >> ((byte)uv_shift & 0x1f);
  iVar3 = height >> ((byte)uv_shift & 0x1f);
  _i_src = dst[1];
  iVar1 = dst_stride[1];
  pdst = (short *)src_uv;
  for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < iVar2; psrc._4_4_ = psrc._4_4_ + 1) {
      *(short *)(_i_src + (long)psrc._4_4_ * 2) = pdst[psrc._4_4_ << 1];
    }
    pdst = pdst + (src_stridec >> 1);
    _i_src = _i_src + (long)(iVar1 >> 1) * 2;
  }
  pdst = (short *)(src_uv + 2);
  _i_src = dst[2];
  iVar1 = dst_stride[2];
  for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
    for (psrc._4_4_ = 0; psrc._4_4_ < iVar2; psrc._4_4_ = psrc._4_4_ + 1) {
      *(short *)(_i_src + (long)psrc._4_4_ * 2) = pdst[psrc._4_4_ << 1];
    }
    pdst = pdst + (src_stridec >> 1);
    _i_src = _i_src + (long)(iVar1 >> 1) * 2;
  }
  return;
}

Assistant:

static void conv_fmt_16bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    short* pdst = (short*)dst[0];
    int width2 = width << 1;
    int i_src = src_stride >> 1;
    int i_dst = dst_stride[0] >> 1;

    for (i = 0; i < height; i++) {
        memcpy(pdst, psrc, width2);
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = (short*)dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1] >> 1;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = (short*)dst[2];
    i_dst = dst_stride[2] >> 1;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}